

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilBitMatrix.c
# Opt level: O2

int Extra_BitMatrixCountOnesUpper(Extra_BitMat_t *p)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar1 = p->nSize;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  iVar3 = 0;
  uVar2 = 0;
  while (uVar4 = uVar2, uVar4 != uVar5) {
    uVar7 = uVar4 + 1 & 0xffffffff;
    while (uVar6 = (uint)uVar7, uVar2 = uVar4 + 1, (int)uVar6 < (int)uVar1) {
      iVar3 = iVar3 + (uint)((p->ppData[uVar4][uVar7 >> 5] >> (uVar6 & 0x1f) & 1) != 0);
      uVar7 = (ulong)(uVar6 + 1);
    }
  }
  return iVar3;
}

Assistant:

int Extra_BitMatrixCountOnesUpper( Extra_BitMat_t * p )
{
    int i, k, nTotal = 0;
    for ( i = 0; i < p->nSize; i++ )
        for ( k = i + 1; k < p->nSize; k++ )
            nTotal += ( (p->ppData[i][k>>5] & (1 << (k&31))) > 0 );
    return nTotal;
}